

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void __thiscall
kratos::DebugDatabase::set_break_points(DebugDatabase *this,Generator *top,string *ext)

{
  long *plVar1;
  pointer pcVar2;
  pointer ppVar3;
  int iVar4;
  long *plVar5;
  undefined1 filename [8];
  bool bVar6;
  undefined1 local_c0 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  fn_ln;
  Stmt *stmt;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_80;
  undefined1 local_58 [8];
  string fn_ext;
  
  extract_debug_break_points
            ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)&local_80,top);
  std::vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_>::_M_move_assign
            ((vector<const_kratos::Stmt_*,_std::allocator<const_kratos::Stmt_*>_> *)this,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_80.first._M_dataplus._M_p,
                    local_80.first.field_2._M_allocated_capacity -
                    (long)local_80.first._M_dataplus._M_p);
  }
  plVar5 = *(long **)this;
  plVar1 = *(long **)(this + 8);
  fn_ext.field_2._8_8_ = this;
  if (plVar5 != plVar1) {
    do {
      fn_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar5;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)local_c0,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                *)&((fn_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->first)._M_string_length);
      ppVar3 = fn_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (filename = local_c0; filename != (undefined1  [8])ppVar3;
          filename = (undefined1  [8])((long)filename + 0x28)) {
        while( true ) {
          fs::get_ext((string *)local_58,(string *)filename);
          if (fn_ext._M_dataplus._M_p == (pointer)ext->_M_string_length) {
            if (fn_ext._M_dataplus._M_p == (pointer)0x0) {
              bVar6 = true;
            }
            else {
              iVar4 = bcmp((void *)local_58,(ext->_M_dataplus)._M_p,(size_t)fn_ext._M_dataplus._M_p)
              ;
              bVar6 = iVar4 == 0;
            }
          }
          else {
            bVar6 = false;
          }
          if (!bVar6) break;
          local_80.first._M_dataplus._M_p = (pointer)&local_80.first.field_2;
          pcVar2 = (((pointer)filename)->first)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,pcVar2,
                     pcVar2 + (((pointer)filename)->first)._M_string_length);
          local_80.second = ((pointer)filename)->second;
          std::
          _Rb_tree<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
          ::_M_emplace_unique<kratos::Stmt_const*&,std::pair<std::__cxx11::string,unsigned_int>>
                    ((_Rb_tree<kratos::Stmt_const*,std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<kratos::Stmt_const*>,std::allocator<std::pair<kratos::Stmt_const*const,std::pair<std::__cxx11::string,unsigned_int>>>>
                      *)(this + 0x18),
                     (Stmt **)&fn_ln.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
            operator_delete(local_80.first._M_dataplus._M_p,
                            local_80.first.field_2._M_allocated_capacity + 1);
          }
          if (local_58 != (undefined1  [8])&fn_ext._M_string_length) {
            operator_delete((void *)local_58,fn_ext._M_string_length + 1);
          }
          filename = (undefined1  [8])((long)filename + 0x28);
          if (bVar6 || filename == (undefined1  [8])ppVar3) goto LAB_001ea694;
        }
        if (local_58 != (undefined1  [8])&fn_ext._M_string_length) {
          operator_delete((void *)local_58,fn_ext._M_string_length + 1);
        }
      }
LAB_001ea694:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 *)local_c0);
      plVar5 = plVar5 + 1;
    } while (plVar5 != plVar1);
  }
  compute_generators((DebugDatabase *)fn_ext.field_2._8_8_,top);
  return;
}

Assistant:

void DebugDatabase::set_break_points(Generator *top, const std::string &ext) {
    // set the break points
    break_points_ = extract_debug_break_points(top);

    // index all the front-end code
    // we are only interested in the files that has the extension
    for (auto const *stmt : break_points_) {
        auto fn_ln = stmt->fn_name_ln;
        for (auto const &[fn, ln] : fn_ln) {
            auto fn_ext = fs::get_ext(fn);
            if (fn_ext == ext) {
                // this is the one we need
                stmt_mapping_.emplace(stmt, std::make_pair(fn, ln));
                break;
            }
        }
    }
    // set generators
    compute_generators(top);
}